

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::log_internal::ProtoField::DecodeFrom(ProtoField *this,Span<const_char> *data)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  unsigned_long *puVar5;
  size_type n;
  size_type local_40;
  Span<const_char> local_38;
  uint64_t local_28;
  uint64_t tag_type;
  Span<const_char> *data_local;
  ProtoField *this_local;
  
  tag_type = (uint64_t)data;
  data_local = (Span<const_char> *)this;
  bVar1 = Span<const_char>::empty(data);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = anon_unknown_4::DecodeVarint((Span<const_char> *)tag_type);
    this->tag_ = local_28 >> 3;
    this->type_ = (ulong)((uint)local_28 & 7);
    switch(this->type_) {
    case kVarint:
      uVar3 = anon_unknown_4::DecodeVarint((Span<const_char> *)tag_type);
      this->value_ = uVar3;
      break;
    case k64Bit:
      uVar3 = anon_unknown_4::Decode64Bit((Span<const_char> *)tag_type);
      this->value_ = uVar3;
      break;
    case kLengthDelimited:
      uVar4 = anon_unknown_4::DecodeVarint((Span<const_char> *)tag_type);
      uVar3 = tag_type;
      this->value_ = uVar4;
      local_40 = Span<const_char>::size((Span<const_char> *)tag_type);
      puVar5 = std::min<unsigned_long>(&this->value_,&local_40);
      local_38 = Span<const_char>::subspan((Span<const_char> *)uVar3,0,*puVar5);
      uVar3 = tag_type;
      (this->data_).ptr_ = local_38.ptr_;
      (this->data_).len_ = local_38.len_;
      n = Span<const_char>::size(&this->data_);
      Span<const_char>::remove_prefix((Span<const_char> *)uVar3,n);
      break;
    case k32Bit:
      uVar2 = anon_unknown_4::Decode32Bit((Span<const_char> *)tag_type);
      this->value_ = (ulong)uVar2;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ProtoField::DecodeFrom(absl::Span<const char> *data) {
  if (data->empty()) return false;
  const uint64_t tag_type = DecodeVarint(data);
  tag_ = tag_type >> 3;
  type_ = static_cast<WireType>(tag_type & 0x07);
  switch (type_) {
    case WireType::kVarint:
      value_ = DecodeVarint(data);
      break;
    case WireType::k64Bit:
      value_ = Decode64Bit(data);
      break;
    case WireType::kLengthDelimited: {
      value_ = DecodeVarint(data);
      data_ = data->subspan(
          0, static_cast<size_t>(std::min<uint64_t>(value_, data->size())));
      data->remove_prefix(data_.size());
      break;
    }
    case WireType::k32Bit:
      value_ = Decode32Bit(data);
      break;
  }
  return true;
}